

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void P_AutoUseHealth(player_t *player,int saveHealth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool skilluse;
  int largehealth;
  int normalhealth;
  int mode;
  AInventory *inv;
  undefined1 local_38 [8];
  TArray<AInventory_*,_AInventory_*> LargeHealthItems;
  TArray<AInventory_*,_AInventory_*> NormalHealthItems;
  int saveHealth_local;
  player_t *player_local;
  
  NormalHealthItems.Count = saveHealth;
  TArray<AInventory_*,_AInventory_*>::TArray
            ((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most);
  TArray<AInventory_*,_AInventory_*>::TArray((TArray<AInventory_*,_AInventory_*> *)local_38);
  for (_normalhealth =
            TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&(player->mo->super_AActor).Inventory);
      _normalhealth != (AInventory *)0x0;
      _normalhealth =
           TObjPtr::operator_cast_to_AInventory_
                     ((TObjPtr *)&(_normalhealth->super_AActor).Inventory)) {
    if ((0 < _normalhealth->Amount) &&
       (bVar1 = DObject::IsKindOf((DObject *)_normalhealth,AHealthPickup::RegistrationInfo.MyClass),
       bVar1)) {
      if (*(int *)&_normalhealth->field_0x4fc == 1) {
        TArray<AInventory_*,_AInventory_*>::Push
                  ((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most,
                   (AInventory **)&normalhealth);
      }
      else if (*(int *)&_normalhealth->field_0x4fc == 2) {
        TArray<AInventory_*,_AInventory_*>::Push
                  ((TArray<AInventory_*,_AInventory_*> *)local_38,(AInventory **)&normalhealth);
      }
    }
  }
  iVar2 = CountHealth((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most);
  iVar3 = CountHealth((TArray<AInventory_*,_AInventory_*> *)local_38);
  iVar4 = G_SkillProperty(SKILLP_AutoUseHealth);
  if ((iVar4 != 0) && ((int)NormalHealthItems.Count <= iVar2)) {
    iVar2 = UseHealthItems((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most,
                           (int *)&NormalHealthItems.Count);
    player->health = iVar2 + player->health;
  }
  else if (iVar3 < (int)NormalHealthItems.Count) {
    if ((iVar4 != 0) && ((int)NormalHealthItems.Count <= iVar2 + iVar3)) {
      iVar2 = UseHealthItems((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most,
                             (int *)&NormalHealthItems.Count);
      player->health = iVar2 + player->health;
      if (0 < (int)NormalHealthItems.Count) {
        iVar2 = UseHealthItems((TArray<AInventory_*,_AInventory_*> *)local_38,
                               (int *)&NormalHealthItems.Count);
        player->health = iVar2 + player->health;
      }
    }
  }
  else {
    iVar2 = UseHealthItems((TArray<AInventory_*,_AInventory_*> *)local_38,
                           (int *)&NormalHealthItems.Count);
    player->health = iVar2 + player->health;
  }
  (player->mo->super_AActor).health = player->health;
  TArray<AInventory_*,_AInventory_*>::~TArray((TArray<AInventory_*,_AInventory_*> *)local_38);
  TArray<AInventory_*,_AInventory_*>::~TArray
            ((TArray<AInventory_*,_AInventory_*> *)&LargeHealthItems.Most);
  return;
}

Assistant:

void P_AutoUseHealth(player_t *player, int saveHealth)
{
	TArray<AInventory *> NormalHealthItems;
	TArray<AInventory *> LargeHealthItems;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 1) NormalHealthItems.Push(inv);
			else if (mode == 2) LargeHealthItems.Push(inv);
		}
	}

	int normalhealth = CountHealth(NormalHealthItems);
	int largehealth = CountHealth(LargeHealthItems);

	bool skilluse = !!G_SkillProperty(SKILLP_AutoUseHealth);

	if (skilluse && normalhealth >= saveHealth)
	{ // Use quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
	}
	else if (largehealth >= saveHealth)
	{ 
		// Use mystic urns
		player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	else if (skilluse && normalhealth + largehealth >= saveHealth)
	{ // Use mystic urns and quartz flasks
		player->health += UseHealthItems(NormalHealthItems, saveHealth);
		if (saveHealth > 0) player->health += UseHealthItems(LargeHealthItems, saveHealth);
	}
	player->mo->health = player->health;
}